

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTAudioEngine_SetGlobalVariable(FACTAudioEngine *pEngine,uint16_t nIndex,float nValue)

{
  undefined2 in_register_00000032;
  ulong uVar1;
  float fVar2;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  uVar1 = (ulong)(CONCAT22(in_register_00000032,nIndex) << 4);
  fVar2 = *(float *)((long)&pEngine->variables->maxValue + uVar1);
  if ((nValue <= fVar2) &&
     (fVar2 = *(float *)((long)&pEngine->variables->minValue + uVar1), fVar2 <= nValue)) {
    fVar2 = nValue;
  }
  pEngine->globalVariableValues[CONCAT22(in_register_00000032,nIndex)] = fVar2;
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_SetGlobalVariable(
	FACTAudioEngine *pEngine,
	uint16_t nIndex,
	float nValue
) {
	FACTVariable *var;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	var = &pEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x02));
	FAudio_assert(!(var->accessibility & 0x04));
	pEngine->globalVariableValues[nIndex] = FAudio_clamp(
		nValue,
		var->minValue,
		var->maxValue
	);

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}